

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::detail::generic_type::def_property_static_impl
          (generic_type *this,char *name,handle fget,handle fset,function_record *rec_fget)

{
  byte bVar1;
  internals *piVar2;
  char *pcVar3;
  bool bVar4;
  handle property;
  object oStack_98;
  object local_90;
  handle local_88;
  object local_80;
  object local_78;
  generic_type *local_70;
  handle local_68;
  handle local_60;
  handle local_58 [2];
  PyObject *local_48;
  char *local_40;
  object local_38;
  
  bVar1 = options::global_state()::instance;
  bVar4 = true;
  if ((rec_fget->field_0x59 & 0x20) != 0) {
    bVar4 = (rec_fget->scope).m_ptr == (PyObject *)0x0;
  }
  pcVar3 = rec_fget->doc;
  local_70 = this;
  if (bVar4) {
    piVar2 = get_internals();
    local_58[0].m_ptr = (PyObject *)piVar2->static_property_type;
  }
  else {
    local_58[0].m_ptr = (PyObject *)&PyProperty_Type;
  }
  local_60.m_ptr = fget.m_ptr;
  if (fget.m_ptr == (PyObject *)0x0) {
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    local_78.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_68.m_ptr = fset.m_ptr;
  if (fset.m_ptr == (PyObject *)0x0) {
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    local_80.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_90.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  if ((pcVar3 != (char *)0x0 & bVar1) == 0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = rec_fget->doc;
  }
  str::str((str *)&oStack_98,pcVar3);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_88,local_58,&local_60,(none *)&local_68,
             (str *)&local_90);
  local_48 = (local_70->super_object).super_handle.m_ptr;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_40 = name;
  accessor_policies::str_attr::set((handle)local_48,name,local_88);
  object::~object(&local_38);
  object::~object((object *)&local_88);
  object::~object(&oStack_98);
  object::~object(&local_90);
  if (fset.m_ptr == (PyObject *)0x0) {
    object::~object(&local_80);
  }
  if (fget.m_ptr == (PyObject *)0x0) {
    object::~object(&local_78);
  }
  return;
}

Assistant:

void def_property_static_impl(const char *name,
                                  handle fget, handle fset,
                                  detail::function_record *rec_fget) {
        const auto is_static = !(rec_fget->is_method && rec_fget->scope);
        const auto has_doc = rec_fget->doc && pybind11::options::show_user_defined_docstrings();

        auto property = handle((PyObject *) (is_static ? get_internals().static_property_type
                                                       : &PyProperty_Type));
        attr(name) = property(fget.ptr() ? fget : none(),
                              fset.ptr() ? fset : none(),
                              /*deleter*/none(),
                              pybind11::str(has_doc ? rec_fget->doc : ""));
    }